

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_path_relationship_reversed_at(mg_path *path,uint32_t pos)

{
  int64_t idx;
  uint32_t pos_local;
  mg_path *path_local;
  int local_4;
  
  if (pos < path->sequence_length >> 1) {
    if (path->sequence[pos << 1] < 0) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int mg_path_relationship_reversed_at(const mg_path *path, uint32_t pos) {
  if (pos < path->sequence_length / 2) {
    int64_t idx = path->sequence[2 * pos];
    if (idx < 0) {
      return 1;
    } else {
      return 0;
    }
  } else {
    return -1;
  }
}